

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_compareIncompatibleMultiplierSimple_Test::TestBody
          (Units_compareIncompatibleMultiplierSimple_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  UnitsPtr u2;
  UnitsPtr u1;
  double local_88;
  long *local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Units::create();
  psVar1 = local_30;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"metre","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
  libcellml::Units::addUnit(local_30,(int)&local_80,1.0,1.0,(string *)0x0);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_40;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"second","");
  pcVar3 = "";
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"","");
  libcellml::Units::addUnit(local_40,(int)&local_80,1.0,1.0,(string *)0x0);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  local_60[0] = (long *)0x0;
  local_88 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_30,(shared_ptr *)&local_40,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_80,"0.0","libcellml::Units::scalingFactor(u1, u2)",
             (double *)local_60,&local_88);
  if (local_80._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_60);
    if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x497,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_60[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_60[0] != (long *)0x0)) {
        (**(code **)(*local_60[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60[0] = (long *)0x0;
  local_88 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_40,(shared_ptr *)&local_30,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_80,"0.0","libcellml::Units::scalingFactor(u2, u1)",
             (double *)local_60,&local_88);
  if (local_80._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_60);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x498,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (local_60[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_60[0] != (long *)0x0)) {
        (**(code **)(*local_60[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Units, compareIncompatibleMultiplierSimple)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("metre", 0, 1.0, 1.0);
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("second", 0, 1.0, 1.0);

    // Incompatible units return a scaling factor of 0.0.
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}